

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O3

void arrangeQuoters_superFast_moreThen5
               (word *pInOut,word *temp,int start,int iQ,int jQ,int kQ,int lQ,int iVar,
               char *pCanonPerm,uint *pCanonPhase)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  word *__dest;
  size_t __n;
  
  if (jQ != 1 || iQ != 0) {
    bVar3 = (char)iVar - 6;
    iVar1 = 1 << (bVar3 & 0x1f);
    uVar4 = start - iVar1;
    if (uVar4 != 0 && iVar1 <= start) {
      lVar5 = (long)iVar1;
      __dest = temp + start;
      __n = (size_t)(8 << (bVar3 & 0x1f));
      do {
        memcpy(__dest + -lVar5,pInOut + ((ulong)uVar4 - (long)(iQ << (bVar3 & 0x1f))),__n);
        memcpy(__dest + lVar5 * -2,pInOut + ((ulong)uVar4 - (long)(jQ << (bVar3 & 0x1f))),__n);
        memcpy(__dest + lVar5 * -3,pInOut + ((ulong)uVar4 - (long)(kQ << (bVar3 & 0x1f))),__n);
        __dest = __dest + lVar5 * -4;
        memcpy(__dest,pInOut + ((ulong)uVar4 - (long)(lQ << (bVar3 & 0x1f))),__n);
        uVar4 = uVar4 + (-4 << (bVar3 & 0x1f));
      } while (0 < (int)uVar4);
    }
    memcpy(pInOut,temp,(long)start << 3);
    iVar2 = iQ - jQ;
    iVar1 = -iVar2;
    if (0 < iVar2) {
      iVar1 = iVar2;
    }
    uVar4 = adjustInfoAfterSwap(pCanonPerm,*pCanonPhase,iVar,iQ + -4 + iVar1 * 4);
    *pCanonPhase = uVar4;
  }
  return;
}

Assistant:

void arrangeQuoters_superFast_moreThen5(word* pInOut, word* temp, int start,  int iQ, int jQ, int kQ, int lQ, int iVar, char * pCanonPerm, unsigned* pCanonPhase)
{
    int i,wordBlock,blockSize,shiftSize;
    word* tempPtr = temp+start;
//     printf("in arrangeQuoters_superFast_moreThen5\n");

    if(iQ == 0 && jQ == 1)
        return;
    wordBlock = (1<<(iVar-6));
    blockSize = wordBlock*sizeof(word);
    shiftSize = wordBlock*4;
    for(i=start-wordBlock;i>0;i-=shiftSize)
    {       
        tempPtr -= wordBlock;       
        memcpy(tempPtr, pInOut+i-iQ*wordBlock, (size_t)blockSize);
        tempPtr -= wordBlock;
        memcpy(tempPtr, pInOut+i-jQ*wordBlock, (size_t)blockSize);
        tempPtr -= wordBlock;
        memcpy(tempPtr, pInOut+i-kQ*wordBlock, (size_t)blockSize);
        tempPtr -= wordBlock;
        memcpy(tempPtr, pInOut+i-lQ*wordBlock, (size_t)blockSize);      
    }   
    memcpy(pInOut, temp, start*sizeof(word));
    updataInfo(iQ, jQ, iVar, pCanonPerm, pCanonPhase);
//    printf("out arrangeQuoters_superFast_moreThen5\n");

}